

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
::insert(map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
         *this,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  long lVar5;
  
  pNVar1 = this->nil;
  pNVar4 = pNVar1;
  pNVar3 = pNVar1;
  while (pNVar2 = pNVar3->left, pNVar2 != pNVar1) {
    pNVar4 = pNVar2;
    pNVar3 = (Node *)(&pNVar2->value + (pNVar2->value->first <= node->value->first));
  }
  if (pNVar4 == pNVar1) {
    lVar5 = 0x10;
  }
  else {
    lVar5 = (ulong)(pNVar4->value->first <= node->value->first) * 8 + 0x10;
  }
  *(Node **)((long)&pNVar4->value + lVar5) = node;
  node->right = pNVar1;
  node->left = pNVar1;
  node->parent = pNVar4;
  this->tot = this->tot + 1;
  insert_fixup(this,node);
  pNVar3 = this->nil;
  pNVar3->parent = pNVar3;
  pNVar3 = findmin(this,pNVar3);
  this->nodebegin = pNVar3;
  return;
}

Assistant:

void insert(Node * const node)//node -> color == RED
	{
		Node *x = nil -> left , *y = nil;
		for (;x != nil;y = x , x = compare(node -> value -> first , x -> value -> first) ? x -> left : x -> right);
		if (y == nil || compare(node -> value -> first , y -> value -> first)) y -> left = node;
		else y -> right = node;
		node -> left = node -> right = nil , node -> parent = y;
		++ tot , insert_fixup(node) , nil -> parent = nil , nodebegin = findmin(nil);
	}